

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid,REF_INT first,REF_INT skip)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_node;
  REF_INT node1;
  REF_INT node0;
  REF_GLOB global;
  REF_BOOL allowed;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_NODE ref_node;
  REF_INT skip_local;
  REF_INT first_local;
  REF_GRID ref_grid_local;
  
  ref_edge = (REF_EDGE)ref_grid->node;
  ref_node._0_4_ = skip;
  ref_node._4_4_ = first;
  _skip_local = ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&allowed,ref_grid);
  if (uVar1 == 0) {
    for (global._4_4_ = ref_node._4_4_; global._4_4_ < _allowed->n;
        global._4_4_ = (REF_INT)ref_node + global._4_4_) {
      new_node = _allowed->e2n[global._4_4_ << 1];
      ref_private_macro_code_rss = _allowed->e2n[global._4_4_ * 2 + 1];
      uVar1 = ref_cell_has_side(_skip_local->cell[8],new_node,ref_private_macro_code_rss,
                                (REF_BOOL *)&global);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x389,"ref_split_edge_pattern",(ulong)uVar1,"has side");
        return uVar1;
      }
      if ((int)global != 0) {
        uVar1 = ref_split_edge_mixed
                          (_skip_local,new_node,ref_private_macro_code_rss,(REF_BOOL *)&global);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x38c,"ref_split_edge_pattern",(ulong)uVar1,"mixed");
          return uVar1;
        }
        if ((int)global != 0) {
          uVar1 = ref_cell_local_gem(_skip_local->cell[8],(REF_NODE)ref_edge,new_node,
                                     ref_private_macro_code_rss,(REF_BOOL *)&global);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x391,"ref_split_edge_pattern",(ulong)uVar1,"local tet");
            return uVar1;
          }
          if ((int)global != 0) {
            uVar1 = ref_node_next_global((REF_NODE)ref_edge,(REF_GLOB *)&node1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x394,"ref_split_edge_pattern",(ulong)uVar1,"next global");
              return uVar1;
            }
            uVar1 = ref_node_add((REF_NODE)ref_edge,_node1,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x395,"ref_split_edge_pattern",(ulong)uVar1,"new node");
              return uVar1;
            }
            uVar1 = ref_node_interpolate_edge
                              ((REF_NODE)ref_edge,new_node,ref_private_macro_code_rss,0.5,
                               ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x397,"ref_split_edge_pattern",(ulong)uVar1,"interp new node");
              return uVar1;
            }
            uVar1 = ref_geom_add_between
                              (_skip_local,new_node,ref_private_macro_code_rss,0.5,
                               ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x399,"ref_split_edge_pattern",(ulong)uVar1,"geom new node");
              return uVar1;
            }
            uVar1 = ref_geom_constrain(_skip_local,ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x39a,"ref_split_edge_pattern",(ulong)uVar1,"geom constraint");
              return uVar1;
            }
            uVar1 = ref_metric_interpolate_between
                              (_skip_local,new_node,ref_private_macro_code_rss,
                               ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x39c,"ref_split_edge_pattern",(ulong)uVar1,"interp new node metric");
              return uVar1;
            }
            uVar1 = ref_split_edge(_skip_local,new_node,ref_private_macro_code_rss,
                                   ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x39e,"ref_split_edge_pattern",(ulong)uVar1,"split");
              return uVar1;
            }
          }
        }
      }
    }
    ref_edge_free(_allowed);
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",899,
           "ref_split_edge_pattern",(ulong)uVar1,"orig edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_pattern(REF_GRID ref_grid, REF_INT first,
                                          REF_INT skip) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge;
  REF_BOOL allowed;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  for (edge = first; edge < ref_edge_n(ref_edge); edge += skip) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
        "has side");
    if (!allowed) continue;

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (!allowed) continue;

    RSS(ref_cell_local_gem(ref_grid_tet(ref_grid), ref_node, node0, node1,
                           &allowed),
        "local tet");
    if (!allowed) continue;

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");

    RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}